

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::BasicWriter<char>::write_double<double,fmt::FormatSpec>
          (BasicWriter<char> *this,double value,FormatSpec *spec)

{
  char cVar1;
  Alignment AVar2;
  bool bVar3;
  char cVar4;
  uint uVar5;
  CharPtr pcVar6;
  Buffer<char> *pBVar7;
  byte *pbVar8;
  Buffer<char> *pBVar9;
  uint uVar10;
  char *pcVar11;
  char cVar12;
  size_t __len_1;
  size_t sVar13;
  char *pcVar14;
  ulong uVar15;
  size_t __len;
  ulong __n;
  Buffer<char> **ppBVar16;
  ulong __n_00;
  byte bVar17;
  bool bVar18;
  ulong in_XMM0_Qb;
  char format [10];
  uint local_68;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar19;
  undefined4 in_stack_ffffffffffffffa4;
  wchar_t wVar20;
  char local_52 [10];
  double local_48;
  ulong uStack_40;
  
  bVar17 = spec->type_;
  uVar10 = bVar17 - 0x41;
  if (uVar10 < 0x27) {
    if ((0x71UL >> ((ulong)uVar10 & 0x3f) & 1) == 0) {
      if ((0x7100000000U >> ((ulong)uVar10 & 0x3f) & 1) == 0) goto LAB_00151ede;
      goto LAB_00151c9d;
    }
    bVar3 = true;
  }
  else {
LAB_00151ede:
    if (bVar17 != 0) {
      internal::report_unknown_type
                ((char)((ulong)spec >> 0x38),
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    }
    bVar17 = 0x67;
LAB_00151c9d:
    bVar3 = false;
  }
  if ((long)value < 0) {
    cVar12 = '-';
    if (NAN(value)) goto LAB_0015203a;
    if (value <= -INFINITY) goto LAB_00151d2a;
    value = -value;
    in_XMM0_Qb = in_XMM0_Qb ^ 0x8000000000000000;
    pBVar7 = this->buffer_;
    sVar13 = pBVar7->size_;
    uVar10 = (spec->super_AlignSpec).super_WidthSpec.width_;
    uVar19 = 0x2d;
LAB_00151da1:
    if (pBVar7->capacity_ < (uVar10 + (uVar10 == 0)) + sVar13) {
      local_48 = value;
      uStack_40 = in_XMM0_Qb;
      (**pBVar7->_vptr_Buffer)(pBVar7);
      value = local_48;
      in_XMM0_Qb = uStack_40;
    }
    bVar18 = uVar10 == 0;
    uVar10 = uVar10 - 1;
    bVar3 = false;
    if (bVar18) {
      uVar10 = 0;
    }
    sVar13 = sVar13 + 1;
    uVar5 = spec->flags_;
  }
  else {
    uVar5 = spec->flags_;
    uVar19 = 0x2b;
    if ((uVar5 & 2) == 0) {
      uVar19 = 0x20;
    }
    cVar12 = (char)uVar19;
    if (NAN(value)) {
      if ((uVar5 & 1) == 0) {
        pcVar11 = " NAN";
        pcVar14 = " nan";
LAB_00151ceb:
        if (bVar3) {
          pcVar14 = pcVar11;
        }
        write_str<char>(this,pcVar14 + 1,3,&spec->super_AlignSpec);
        return;
      }
LAB_0015203a:
      pcVar11 = " NAN";
      pcVar14 = " nan";
LAB_00151d38:
      if (bVar3) {
        pcVar14 = pcVar11;
      }
      pcVar6 = write_str<char>(this,pcVar14,4,&spec->super_AlignSpec);
      *pcVar6 = cVar12;
      return;
    }
    if (INFINITY <= value) {
      if ((uVar5 & 1) == 0) {
        pcVar11 = " INF";
        pcVar14 = " inf";
        goto LAB_00151ceb;
      }
LAB_00151d2a:
      pcVar11 = " INF";
      pcVar14 = " inf";
      goto LAB_00151d38;
    }
    pBVar7 = this->buffer_;
    sVar13 = pBVar7->size_;
    uVar10 = (spec->super_AlignSpec).super_WidthSpec.width_;
    if ((uVar5 & 1) != 0) goto LAB_00151da1;
    uVar19 = 0;
    bVar3 = true;
  }
  ppBVar16 = &this->buffer_;
  local_52[0] = '%';
  if ((uVar5 & 8) == 0) {
    pbVar8 = (byte *)(local_52 + 1);
  }
  else {
    pbVar8 = (byte *)(local_52 + 2);
    local_52[1] = 0x23;
  }
  AVar2 = (spec->super_AlignSpec).align_;
  if (AVar2 == ALIGN_CENTER) {
LAB_00151e1d:
    uVar10 = 0;
  }
  else {
    if (AVar2 == ALIGN_LEFT) {
      *pbVar8 = 0x2d;
      pbVar8 = pbVar8 + 1;
    }
    if (uVar10 == 0) goto LAB_00151e1d;
    *pbVar8 = 0x2a;
    pbVar8 = pbVar8 + 1;
  }
  if (-1 < spec->precision_) {
    pbVar8[0] = 0x2e;
    pbVar8[1] = 0x2a;
    pbVar8 = pbVar8 + 2;
  }
  *pbVar8 = bVar17;
  pbVar8[1] = 0;
  wVar20 = (spec->super_AlignSpec).super_WidthSpec.fill_;
  local_48 = value;
  uStack_40 = in_XMM0_Qb;
LAB_00151e4f:
  while( true ) {
    pcVar14 = (*ppBVar16)->ptr_ + sVar13;
    uVar5 = internal::CharTraits<char>::format_float<double>
                      (pcVar14,(*ppBVar16)->capacity_ - sVar13,local_52,uVar10,spec->precision_,
                       local_48);
    cVar12 = (char)uVar19;
    if ((int)uVar5 < 0) goto LAB_00151e9f;
    pBVar7 = *ppBVar16;
    if (uVar5 + sVar13 < pBVar7->capacity_) break;
    uVar15 = uVar5 + sVar13 + 1;
    if (pBVar7->capacity_ < uVar15) goto LAB_00151eb0;
  }
  if (bVar3) {
    cVar12 = '\0';
    goto LAB_00151f0d;
  }
  AVar2 = (spec->super_AlignSpec).align_;
  if (AVar2 == ALIGN_RIGHT) {
    cVar1 = *pcVar14;
joined_r0x00151efe:
    cVar4 = (char)wVar20;
    if (cVar1 != ' ') goto LAB_00151f02;
  }
  else {
    if (AVar2 == ALIGN_DEFAULT) {
      cVar1 = *pcVar14;
      goto joined_r0x00151efe;
    }
LAB_00151f02:
    cVar4 = cVar12;
    cVar12 = '\0';
  }
  pcVar14[-1] = cVar4;
  uVar5 = uVar5 + 1;
LAB_00151f0d:
  if ((spec->super_AlignSpec).align_ == ALIGN_CENTER) {
    uVar10 = (spec->super_AlignSpec).super_WidthSpec.width_;
    if (uVar5 < uVar10) {
      pBVar7 = *ppBVar16;
      sVar13 = pBVar7->size_;
      uVar15 = sVar13 + uVar10;
      pBVar9 = pBVar7;
      if (pBVar7->capacity_ < uVar15) {
        (**pBVar7->_vptr_Buffer)(pBVar7,uVar15);
        pBVar9 = *ppBVar16;
      }
      pBVar7->size_ = uVar15;
      pcVar14 = pBVar9->ptr_ + sVar13;
      __n_00 = (ulong)uVar5;
      memmove(pcVar14 + (uVar10 - uVar5 >> 1),pcVar14,__n_00);
      uVar10 = (spec->super_AlignSpec).super_WidthSpec.width_;
      uVar15 = uVar10 - __n_00;
      __n = uVar15 >> 1;
      if (1 < uVar15) {
        local_68 = wVar20 & 0xff;
        memset(pcVar14,local_68,__n);
      }
      if (uVar10 == uVar5) {
        return;
      }
      memset(pcVar14 + __n_00 + __n,wVar20 & 0xff,uVar15 - __n);
      return;
    }
  }
  if ((cVar12 != '\0') || ((spec->super_AlignSpec).super_WidthSpec.fill_ != L' ')) {
    cVar1 = *pcVar14;
    while (cVar1 == ' ') {
      *pcVar14 = (char)wVar20;
      cVar1 = pcVar14[1];
      pcVar14 = pcVar14 + 1;
    }
    if (cVar12 != '\0') {
      pcVar14[-1] = cVar12;
    }
  }
  pBVar7 = *ppBVar16;
  uVar15 = (ulong)uVar5 + pBVar7->size_;
  if (pBVar7->capacity_ < uVar15) {
    (**pBVar7->_vptr_Buffer)(pBVar7,uVar15);
  }
  pBVar7->size_ = uVar15;
  return;
LAB_00151e9f:
  pBVar7 = *ppBVar16;
  if (pBVar7->capacity_ != 0xffffffffffffffff) {
    uVar15 = pBVar7->capacity_ + 1;
LAB_00151eb0:
    (**pBVar7->_vptr_Buffer)(pBVar7,uVar15);
  }
  goto LAB_00151e4f;
}

Assistant:

void BasicWriter<Char>::write_double(T value, const Spec &spec)
{
    // Check type.
    char type = spec.type();
    bool upper = false;
    switch (type)
    {
    case 0:
        type = 'g';
        break;
    case 'e':
    case 'f':
    case 'g':
    case 'a':
        break;
    case 'F':
#if FMT_MSC_VER
        // MSVC's printf doesn't support 'F'.
        type = 'f';
#endif
    // Fall through.
    case 'E':
    case 'G':
    case 'A':
        upper = true;
        break;
    default:
        internal::report_unknown_type(type, "double");
        break;
    }

    char sign = 0;
    // Use isnegative instead of value < 0 because the latter is always
    // false for NaN.
    if (internal::FPUtil::isnegative(static_cast<double>(value)))
    {
        sign = '-';
        value = -value;
    }
    else if (spec.flag(SIGN_FLAG))
    {
        sign = spec.flag(PLUS_FLAG) ? '+' : ' ';
    }

    if (internal::FPUtil::isnotanumber(value))
    {
        // Format NaN ourselves because sprintf's output is not consistent
        // across platforms.
        std::size_t nan_size = 4;
        const char *nan = upper ? " NAN" : " nan";
        if (!sign)
        {
            --nan_size;
            ++nan;
        }
        CharPtr out = write_str(nan, nan_size, spec);
        if (sign)
            *out = sign;
        return;
    }

    if (internal::FPUtil::isinfinity(value))
    {
        // Format infinity ourselves because sprintf's output is not consistent
        // across platforms.
        std::size_t inf_size = 4;
        const char *inf = upper ? " INF" : " inf";
        if (!sign)
        {
            --inf_size;
            ++inf;
        }
        CharPtr out = write_str(inf, inf_size, spec);
        if (sign)
            *out = sign;
        return;
    }

    std::size_t offset = buffer_.size();
    unsigned width = spec.width();
    if (sign)
    {
        buffer_.reserve(buffer_.size() + (width > 1u ? width : 1u));
        if (width > 0)
            --width;
        ++offset;
    }

    // Build format string.
    enum
    {
        MAX_FORMAT_SIZE = 10
    }; // longest format: %#-*.*Lg
    Char format[MAX_FORMAT_SIZE];
    Char *format_ptr = format;
    *format_ptr++ = '%';
    unsigned width_for_sprintf = width;
    if (spec.flag(HASH_FLAG))
        *format_ptr++ = '#';
    if (spec.align() == ALIGN_CENTER)
    {
        width_for_sprintf = 0;
    }
    else
    {
        if (spec.align() == ALIGN_LEFT)
            *format_ptr++ = '-';
        if (width != 0)
            *format_ptr++ = '*';
    }
    if (spec.precision() >= 0)
    {
        *format_ptr++ = '.';
        *format_ptr++ = '*';
    }

    append_float_length(format_ptr, value);
    *format_ptr++ = type;
    *format_ptr = '\0';

    // Format using snprintf.
    Char fill = internal::CharTraits<Char>::cast(spec.fill());
    unsigned n = 0;
    Char *start = FMT_NULL;
    for (;;)
    {
        std::size_t buffer_size = buffer_.capacity() - offset;
#if FMT_MSC_VER
        // MSVC's vsnprintf_s doesn't work with zero size, so reserve
        // space for at least one extra character to make the size non-zero.
        // Note that the buffer's capacity will increase by more than 1.
        if (buffer_size == 0)
        {
            buffer_.reserve(offset + 1);
            buffer_size = buffer_.capacity() - offset;
        }
#endif
        start = &buffer_[offset];
        int result = internal::CharTraits<Char>::format_float(start, buffer_size, format, width_for_sprintf, spec.precision(), value);
        if (result >= 0)
        {
            n = internal::to_unsigned(result);
            if (offset + n < buffer_.capacity())
                break; // The buffer is large enough - continue with formatting.
            buffer_.reserve(offset + n + 1);
        }
        else
        {
            // If result is negative we ask to increase the capacity by at least 1,
            // but as std::vector, the buffer grows exponentially.
            buffer_.reserve(buffer_.capacity() + 1);
        }
    }
    if (sign)
    {
        if ((spec.align() != ALIGN_RIGHT && spec.align() != ALIGN_DEFAULT) || *start != ' ')
        {
            *(start - 1) = sign;
            sign = 0;
        }
        else
        {
            *(start - 1) = fill;
        }
        ++n;
    }
    if (spec.align() == ALIGN_CENTER && spec.width() > n)
    {
        width = spec.width();
        CharPtr p = grow_buffer(width);
        std::memmove(get(p) + (width - n) / 2, get(p), n * sizeof(Char));
        fill_padding(p, spec.width(), n, fill);
        return;
    }
    if (spec.fill() != ' ' || sign)
    {
        while (*start == ' ')
            *start++ = fill;
        if (sign)
            *(start - 1) = sign;
    }
    grow_buffer(n);
}